

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_chunk_count(exr_context_t ctxt,int part_index,int32_t val)

{
  exr_result_t eVar1;
  undefined4 in_EDX;
  int in_ESI;
  char *in_RDI;
  exr_priv_part_t part;
  int32_t in_stack_00000010;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_attribute_t **in_stack_00000040;
  exr_const_context_t in_stack_ffffffffffffffd0;
  exr_const_context_t c;
  int local_24;
  exr_result_t local_4;
  
  local_24 = 0;
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffd0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffd0);
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock(c);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock(c);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else {
        if (c->real_user_data == (void *)0x0) {
          local_24 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)CONCAT44(part_index,val),
                                       (char *)attr,rv,in_stack_00000010,(uint8_t **)part,
                                       in_stack_00000040);
        }
        else if (*(int *)((long)c->real_user_data + 0x14) != 10) {
          internal_exr_unlock(c);
          eVar1 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)((long)c->real_user_data + 8),"chunkCount");
          return eVar1;
        }
        if (local_24 == 0) {
          *(undefined4 *)((long)c->real_user_data + 0x18) = in_EDX;
          *(undefined4 *)((long)&(c->first_part).compression + 4) = in_EDX;
        }
        internal_exr_unlock(c);
        local_4 = local_24;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_set_chunk_count (exr_context_t ctxt, int part_index, int32_t val)
{
    REQ_ATTR_FIND_CREATE (chunkCount, EXR_ATTR_INT);
    if (rv == EXR_ERR_SUCCESS)
    {
        attr->i           = val;
        part->chunk_count = val;
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}